

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O1

int __thiscall Epoll::Epoll_Add(Epoll *this,SP_channel *_channel,bool accept_flag)

{
  element_type *peVar1;
  int iVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  
  sVar3 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&(this->Mmap)._M_h,
                  &((_channel->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->fd)
  ;
  if (sVar3 == 0) {
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::shared_ptr<channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->Mmap,
                          &((_channel->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->fd);
    (pmVar4->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (_channel->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar4->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               &(_channel->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    (&((_channel->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->accept_epoll)
    [!accept_flag] = this;
    peVar1 = (_channel->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    epoll_ctl(this->epfd,1,peVar1->fd,(epoll_event *)&peVar1->epevent);
    iVar2 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"the fd is in the epoll list!,Add fail",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Epoll::Epoll_Add(SP_channel _channel,bool accept_flag)
{
    if(Mmap.count(_channel->fd) != 0)
    {
        cout<<"the fd is in the epoll list!,Add fail"<<endl;
        return -1;
    }
    Mmap[_channel->fd] = _channel;
    epoll_event epevent;
    if(accept_flag)
        _channel->accept_epoll = this;
    else
        _channel->attach_epoll = this;
    int flag = epoll_ctl(epfd,EPOLL_CTL_ADD,_channel->fd,&_channel->epevent);
    //cout<<"add fd "<< _channel->fd <<" success!"<<endl;
    return 0;
}